

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void saucyGateWay(Abc_Ntk_t *pNtkOrig,Abc_Obj_t *pNodePo,FILE *gFile,int fBooleanMatching,
                 int fLookForSwaps,int fFixOutputs,int fFixInputs,int fQuiet,int fPrintTree)

{
  saucy_stats stats_00;
  int iVar1;
  int iVar2;
  clock_t cVar3;
  Abc_Obj_t *pNode;
  char *pNodeName;
  Vec_Ptr_t **ppVVar4;
  int *colors_00;
  FILE *__stream;
  clock_t cVar5;
  int local_bc;
  int local_a0;
  FILE *hadi;
  int c_1;
  int c;
  int clk;
  int i;
  int *colors;
  saucy_stats stats;
  saucy *s;
  Abc_Ntk_t *pNtk;
  int fFixOutputs_local;
  int fLookForSwaps_local;
  int fBooleanMatching_local;
  FILE *gFile_local;
  Abc_Obj_t *pNodePo_local;
  Abc_Ntk_t *pNtkOrig_local;
  
  cVar3 = clock();
  if (pNodePo == (Abc_Obj_t *)0x0) {
    s = (saucy *)Abc_NtkDup(pNtkOrig);
  }
  else {
    pNode = Abc_ObjFanin0(pNodePo);
    pNodeName = Abc_ObjName(pNodePo);
    s = (saucy *)Abc_NtkCreateCone(pNtkOrig,pNode,pNodeName,0);
  }
  iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)s);
  if (iVar1 == 0) {
    Abc_Print(0,"This output is not dependent on any input\n");
    Abc_NtkDelete((Abc_Ntk_t *)s);
  }
  else {
    stats._24_8_ = saucy_alloc((Abc_Ntk_t *)s);
    printf("Build functional dependency graph (dependency stats are below) ... ");
    getDependencies((Abc_Ntk_t *)s,*(Vec_Int_t ***)(stats._24_8_ + 0x220),
                    *(Vec_Int_t ***)(stats._24_8_ + 0x228));
    printf("\t--------------------\n");
    ppVVar4 = findTopologicalOrder((Abc_Ntk_t *)s);
    *(Vec_Ptr_t ***)(stats._24_8_ + 0x240) = ppVVar4;
    iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)s);
    iVar2 = Abc_NtkPiNum((Abc_Ntk_t *)s);
    colors_00 = ints(iVar1 + iVar2);
    if (fFixOutputs == 0) {
      for (c = 0; iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)s), c < iVar1; c = c + 1) {
        colors_00[c] = 0;
      }
    }
    else {
      for (c = 0; iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)s), c < iVar1; c = c + 1) {
        colors_00[c] = c;
      }
    }
    if (fFixInputs == 0) {
      if (fFixOutputs == 0) {
        local_bc = 1;
      }
      else {
        local_bc = Abc_NtkPoNum((Abc_Ntk_t *)s);
      }
      for (c = 0; iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)s), c < iVar1; c = c + 1) {
        iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)s);
        colors_00[c + iVar1] = local_bc;
      }
    }
    else {
      if (fFixOutputs == 0) {
        local_a0 = 1;
      }
      else {
        local_a0 = Abc_NtkPoNum((Abc_Ntk_t *)s);
      }
      for (c = 0; iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)s), c < iVar1; c = c + 1) {
        iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)s);
        colors_00[c + iVar1] = local_a0 + c;
      }
    }
    *(int *)(stats._24_8_ + 0x288) = fBooleanMatching;
    if (fBooleanMatching == 0) {
      NUM_SIM1_ITERATION = 200;
      NUM_SIM2_ITERATION = 200;
    }
    else {
      NUM_SIM1_ITERATION = 0x32;
      NUM_SIM2_ITERATION = 0x32;
    }
    if (fQuiet == 0) {
      *(code **)(stats._24_8_ + 0x2b0) = print_automorphism_ntk;
    }
    else {
      *(code **)(stats._24_8_ + 0x2b0) = print_automorphism_quiet;
    }
    if (gFile == (FILE *)0x0) {
      *(FILE **)(stats._24_8_ + 0x298) = _stdout;
    }
    else {
      *(FILE **)(stats._24_8_ + 0x298) = gFile;
    }
    *(int *)(stats._24_8_ + 0x28c) = fPrintTree;
    *(int *)(stats._24_8_ + 0x290) = fLookForSwaps;
    saucy_search((Abc_Ntk_t *)s,(saucy *)stats._24_8_,0,colors_00,(saucy_stats *)&colors);
    stats_00.levels = stats.grpsize_base._4_4_;
    stats_00.grpsize_exp = stats.grpsize_base._0_4_;
    stats_00.grpsize_base = (double)colors;
    stats_00.nodes = stats.grpsize_exp;
    stats_00.bads = stats.levels;
    stats_00.gens = stats.nodes;
    stats_00.support = stats.bads;
    print_stats(_stdout,stats_00);
    if (fBooleanMatching != 0) {
      if ((1.0 < (double)colors) || (0 < (int)stats.grpsize_base._0_4_)) {
        printf("*** Networks are equivalent ***\n");
      }
      else {
        printf("*** Networks are NOT equivalent ***\n");
      }
    }
    saucy_free((saucy *)stats._24_8_);
    Abc_NtkDelete((Abc_Ntk_t *)s);
    __stream = fopen("hadi.txt","a");
    fprintf(__stream,"group size = %fe%d\n",colors,(ulong)stats.grpsize_base._0_4_);
    fclose(__stream);
    Abc_Print(1,"%s =","Runtime");
    cVar5 = clock();
    Abc_Print(1,"%9.2f sec\n",((double)(cVar5 - (int)cVar3) * 1.0) / 1000000.0);
  }
  return;
}

Assistant:

void saucyGateWay( Abc_Ntk_t * pNtkOrig, Abc_Obj_t * pNodePo, FILE * gFile, int fBooleanMatching, 
                   int fLookForSwaps, int fFixOutputs, int fFixInputs, int fQuiet, int fPrintTree )
{
    Abc_Ntk_t * pNtk;
    struct saucy *s;
    struct saucy_stats stats;
    int *colors;
    int i, clk = clock();   
    
    if (pNodePo == NULL)
        pNtk = Abc_NtkDup( pNtkOrig );
    else
        pNtk = Abc_NtkCreateCone( pNtkOrig, Abc_ObjFanin0(pNodePo), Abc_ObjName(pNodePo), 0 );
    
    if (Abc_NtkPiNum(pNtk) == 0) {
        Abc_Print( 0, "This output is not dependent on any input\n" );
        Abc_NtkDelete( pNtk );
        return;
    }

    s = saucy_alloc( pNtk );    

    /******* Getting Dependencies *******/  
    printf("Build functional dependency graph (dependency stats are below) ... ");      
    getDependencies( pNtk, s->iDep, s->oDep );
    printf("\t--------------------\n");
    /************************************/

    /* Finding toplogical orde */
    s->topOrder = findTopologicalOrder( pNtk );                 

    /* Setting graph colors: outputs = 0 and inputs = 1 */
    colors = ints(Abc_NtkPoNum(pNtk) + Abc_NtkPiNum(pNtk));
    if (fFixOutputs) {
        for (i = 0; i < Abc_NtkPoNum(pNtk); i++)
            colors[i] = i;
    } else {
        for (i = 0; i < Abc_NtkPoNum(pNtk); i++)
            colors[i] = 0;
    }
    if (fFixInputs) {
        int c = (fFixOutputs) ? Abc_NtkPoNum(pNtk) : 1;
        for (i = 0; i < Abc_NtkPiNum(pNtk); i++)
            colors[i+Abc_NtkPoNum(pNtk)] = c+i;     
    } else {
        int c = (fFixOutputs) ? Abc_NtkPoNum(pNtk) : 1;
        for (i = 0; i < Abc_NtkPiNum(pNtk); i++)
            colors[i+Abc_NtkPoNum(pNtk)] = c;   
    }   

    /* Are we looking for Boolean matching? */
    s->fBooleanMatching = fBooleanMatching;
    if (fBooleanMatching) {
        NUM_SIM1_ITERATION = 50;
        NUM_SIM2_ITERATION = 50;
    } else {
        NUM_SIM1_ITERATION = 200;
        NUM_SIM2_ITERATION = 200;
    }

    /* Set the print automorphism routine */
    if (!fQuiet)
        s->print_automorphism = print_automorphism_ntk;
    else
        s->print_automorphism = print_automorphism_quiet;

    /* Set the output file for generators */
    if (gFile == NULL)
        s->gFile = stdout;
    else
        s->gFile = gFile;

    /* Set print tree option */
    s->fPrintTree = fPrintTree;

    /* Set input permutations option */
    s->fLookForSwaps = fLookForSwaps;

    saucy_search(pNtk, s, 0, colors, &stats);   
    print_stats(stdout, stats);
    if (fBooleanMatching) {
        if (stats.grpsize_base > 1 || stats.grpsize_exp > 0)
            printf("*** Networks are equivalent ***\n");
        else
            printf("*** Networks are NOT equivalent ***\n");
    }
    saucy_free(s);
    Abc_NtkDelete(pNtk);

    if (1) {
        FILE * hadi = fopen("hadi.txt", "a");
        fprintf(hadi, "group size = %fe%d\n",
        stats.grpsize_base, stats.grpsize_exp); 
        fclose(hadi);
    }

    ABC_PRT( "Runtime", clock() - clk );

}